

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O1

unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
__thiscall
duckdb::Binder::BindCreateTableInfo
          (Binder *this,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *info,
          SchemaCatalogEntry *schema)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_RCX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  bound_defaults;
  undefined1 local_30 [8];
  idx_t local_28;
  undefined8 uStack_20;
  optional_ptr<duckdb::CatalogSet,_true> local_18;
  
  local_18.ptr = (CatalogSet *)0x0;
  local_28 = 0;
  uStack_20._0_1_ = INVALID;
  uStack_20._1_7_ = 0;
  local_30 = (undefined1  [8])(schema->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry;
  (schema->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry = (_func_int **)0x0;
  BindCreateTableInfo(this,info,(SchemaCatalogEntry *)local_30,in_RCX);
  if (local_30 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_30 + 8))();
  }
  local_30 = (undefined1  [8])0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_28);
  return (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          )(unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            )this;
}

Assistant:

unique_ptr<BoundCreateTableInfo> Binder::BindCreateTableInfo(unique_ptr<CreateInfo> info, SchemaCatalogEntry &schema) {
	vector<unique_ptr<Expression>> bound_defaults;
	return BindCreateTableInfo(std::move(info), schema, bound_defaults);
}